

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

void __thiscall transaction_tests::test_IsStandard::test_method(test_IsStandard *this)

{
  vector<CTxOut,_std::allocator<CTxOut>_> *this_00;
  uchar uVar1;
  long lVar2;
  const_iterator cVar3;
  pointer pCVar4;
  undefined1 auVar5 [16];
  pointer puVar6;
  bool bVar7;
  int32_t iVar8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar9;
  CScript *pCVar10;
  CMutableTransaction *pCVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  string *reason_in;
  string *reason_in_00;
  string *reason_in_01;
  string *reason_in_02;
  string *reason_in_03;
  string *reason_in_04;
  string *reason_in_05;
  string *reason_in_06;
  string *reason_in_07;
  string *reason_in_08;
  string *reason_in_09;
  string *reason_in_10;
  string *reason_in_11;
  string *reason_in_12;
  string *reason_in_13;
  string *reason_in_14;
  string *reason_in_15;
  string *reason_in_16;
  string *reason_in_17;
  string *reason_in_18;
  string *reason_in_19;
  string *reason_in_20;
  string *reason_in_21;
  string *reason_in_22;
  int op;
  opcodetype oVar15;
  iterator in_R8;
  iterator pvVar16;
  iterator in_R9;
  CAmount *pCVar17;
  iterator pvVar18;
  opcodetype *poVar19;
  _Vector_base<CPubKey,_std::allocator<CPubKey>_> *p_Var20;
  pointer puVar21;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  span<const_std::byte,_18446744073709551615UL> b_04;
  span<const_std::byte,_18446744073709551615UL> b_05;
  span<const_std::byte,_18446744073709551615UL> b_06;
  span<const_std::byte,_18446744073709551615UL> b_07;
  span<const_std::byte,_18446744073709551615UL> b_08;
  span<const_std::byte,_18446744073709551615UL> b_09;
  span<const_std::byte,_18446744073709551615UL> b_10;
  span<const_std::byte,_18446744073709551615UL> b_11;
  span<const_std::byte,_18446744073709551615UL> b_12;
  span<const_std::byte,_18446744073709551615UL> b_13;
  span<const_std::byte,_18446744073709551615UL> b_14;
  initializer_list<unsigned_char> __l;
  span<const_std::byte,_18446744073709551615UL> b_15;
  const_string file_02;
  span<const_std::byte,_18446744073709551615UL> b_16;
  const_string file_03;
  initializer_list<CPubKey> __l_00;
  span<const_std::byte,_18446744073709551615UL> b_17;
  span<const_std::byte,_18446744073709551615UL> b_18;
  span<const_std::byte,_18446744073709551615UL> b_19;
  span<const_std::byte,_18446744073709551615UL> b_20;
  span<const_std::byte,_18446744073709551615UL> b_21;
  span<const_std::byte,_18446744073709551615UL> b_22;
  span<const_std::byte,_18446744073709551615UL> b_23;
  span<const_std::byte,_18446744073709551615UL> b_24;
  span<const_std::byte,_18446744073709551615UL> b_25;
  initializer_list<unsigned_char> __l_01;
  span<const_std::byte,_18446744073709551615UL> b_26;
  const_string file_04;
  check_type cVar22;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined4 local_4dc;
  undefined1 local_4d8 [48];
  const_iterator pc;
  allocator_type local_49c;
  value_type_conflict3 local_49b;
  allocator_type local_49a;
  value_type_conflict3 local_499;
  char *local_498;
  pointer local_490;
  pointer local_488;
  pointer local_480;
  char *local_478;
  char *local_470;
  undefined1 local_468 [48];
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  CAmount nDustThreshold;
  CKey key;
  CMutableTransaction t;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> dummyTransactions;
  CCoinsView coinsDummy;
  undefined1 local_398 [12];
  undefined4 uStack_38c;
  undefined1 *local_388;
  undefined8 uStack_380;
  undefined4 local_378;
  undefined4 uStack_374;
  __index_type local_350;
  _Vector_base<CPubKey,_std::allocator<CPubKey>_> local_310;
  opcodetype opcode;
  undefined1 uStack_2f4;
  undefined1 uStack_2f3;
  undefined1 uStack_2f2;
  undefined1 uStack_2f1;
  undefined1 uStack_2f0;
  undefined1 uStack_2ef;
  undefined1 uStack_2ee;
  undefined1 uStack_2ed;
  undefined1 uStack_2ec;
  undefined1 uStack_2eb;
  undefined1 uStack_2ea;
  undefined1 uStack_2e9;
  shared_count local_2e8;
  char *pcStack_2e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> non_push_ops;
  CCoinsViewCache coins;
  FillableSigningProvider keystore;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_0114aee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore._96_16_ = (undefined1  [16])0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._24_8_ =
       (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._32_8_ =
       (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_12_ =
       ZEXT412(1) << 0x40;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._20_4_ = 0;
  coinsDummy._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_01149610;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CCoinsViewCache::CCoinsViewCache(&coins,&coinsDummy,false);
  uStack_380 = 22000000;
  local_388 = (undefined1 *)0x1406f40;
  local_398._0_8_ = (pointer)0xa7d8c0;
  stack0xfffffffffffffc70 = (pointer)0x2faf080;
  SetupDummyInputs(&dummyTransactions,&keystore,&coins,(array<long,_4UL> *)local_398);
  CMutableTransaction::CMutableTransaction(&t);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&t.vin,1);
  CMutableTransaction::GetHash
            ((Txid *)local_398,
             dummyTransactions.
             super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
             super__Vector_impl_data._M_start);
  pCVar4 = t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
           _M_start;
  *(undefined1 **)
   (((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) = local_388;
  *(undefined8 *)
   (((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uStack_380;
  *(undefined8 *)
   ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_398._0_8_;
  *(undefined8 *)
   (((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       stack0xfffffffffffffc70;
  ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
   )->prevout).n = 1;
  opcode = opcode & ~OP_INVALIDOPCODE;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_398,0x41,
             (value_type_conflict3 *)&opcode,(allocator_type *)&non_push_ops);
  b._M_extent._M_extent_value = stack0xfffffffffffffc70 - local_398._0_8_;
  b._M_ptr = (pointer)local_398._0_8_;
  CScript::operator<<(&pCVar4->scriptSig,b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_398);
  this_00 = &t.vout;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(this_00,1);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 90000000;
  GenerateRandomKey(false);
  CKey::GetPubKey((CPubKey *)&opcode,&key);
  PKHash::PKHash((PKHash *)&local_310,(CPubKey *)&opcode);
  local_388._0_4_ = local_310._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
  stack0xfffffffffffffc70 = local_310._M_impl.super__Vector_impl_data._M_finish;
  local_398._0_8_ = local_310._M_impl.super__Vector_impl_data._M_start;
  local_350 = '\x02';
  GetScriptForDestination((CScript *)&non_push_ops,(CTxDestination *)local_398);
  pCVar11 = (CMutableTransaction *)&non_push_ops;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&non_push_ops);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&non_push_ops);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_398);
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  nDustThreshold = (g_dust.nSatoshisPerK * 0xb6) / 1000;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x32f;
  file.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_428,msg);
  local_398[8] = 0;
  local_398._0_8_ = &PTR__lazy_ostream_01139f30;
  uStack_380 = "";
  local_388 = boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_430 = "";
  opcode = 0x222;
  pvVar16 = (iterator)0x2;
  pCVar17 = &nDustThreshold;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_398,&local_438,0x32f,1,2,pCVar17,"nDustThreshold",(CPubKey *)&opcode,"546");
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = nDustThreshold + -1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"dust",(allocator<char> *)&opcode);
  pCVar11 = (CMutableTransaction *)local_398;
  test_method()::$_1::operator()(&t,pCVar11,reason_in);
  std::__cxx11::string::~string((string *)local_398);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = nDustThreshold;
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  t.version = 0xffffffff;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"version",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_00);
  std::__cxx11::string::~string((string *)local_398);
  t.version = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"version",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_01);
  std::__cxx11::string::~string((string *)local_398);
  t.version = 4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"version",(allocator<char> *)&opcode);
  pCVar11 = (CMutableTransaction *)local_398;
  test_method()::$_1::operator()(&t,pCVar11,reason_in_02);
  std::__cxx11::string::~string((string *)local_398);
  t.version = 1;
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  t.version = 2;
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  g_dust.nSatoshisPerK = 0xe76;
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x2a1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"dust",(allocator<char> *)&opcode);
  pCVar11 = (CMutableTransaction *)local_398;
  test_method()::$_1::operator()(&t,pCVar11,reason_in_03);
  std::__cxx11::string::~string((string *)local_398);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x2a2;
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  g_dust.nSatoshisPerK = 3000;
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  ppVar9 = &CScript::operator<<((CScript *)local_398,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"scriptpubkey",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_04);
  std::__cxx11::string::~string((string *)local_398);
  local_2e8.pi_ = (sp_counted_base *)0x0;
  pcStack_2e0 = (char *)0x0;
  opcode = OP_0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  uStack_2f0 = '\0';
  uStack_2ef = '\0';
  uStack_2ee = '\0';
  uStack_2ed = '\0';
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  pCVar10 = CScript::operator<<((CScript *)&opcode,OP_RETURN);
  memcpy(local_398,util::hex_literals::detail::Hex<161ul>{std::array<std::byte_80ul>,0x50);
  b_00._M_extent._M_extent_value = 0x50;
  b_00._M_ptr = local_398;
  ppVar9 = &CScript::operator<<(pCVar10,b_00)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode);
  local_468._32_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_468._40_8_ = "";
  local_468._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_468._24_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pCVar17;
  msg_00.m_begin = pvVar16;
  file_00.m_end = (iterator)0x358;
  file_00.m_begin = local_468 + 0x20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)(local_468 + 0x10),msg_00);
  local_398[8] = 0;
  local_398._0_8_ = &PTR__lazy_ostream_01139f30;
  local_388 = boost::unit_test::lazy_ostream::inst;
  uStack_380 = (long)"\x05\x04\x03\x02\x01" + 5;
  pCVar11 = (CMutableTransaction *)local_468;
  local_468._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_468._8_8_ = "";
  oVar15 = ((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size;
  opcode = oVar15 - 0x1d;
  if (oVar15 < 0x1d) {
    opcode = oVar15;
  }
  pvVar18 = "S";
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_398,pCVar11,0x358,1,2,&MAX_OP_RETURN_RELAY,"MAX_OP_RETURN_RELAY",
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode,
             "t.vout[0].scriptPubKey.size()");
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  local_2e8.pi_ = (sp_counted_base *)0x0;
  pcStack_2e0 = (char *)0x0;
  opcode = OP_0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  uStack_2f0 = '\0';
  uStack_2ef = '\0';
  uStack_2ee = '\0';
  uStack_2ed = '\0';
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  pCVar10 = CScript::operator<<((CScript *)&opcode,OP_RETURN);
  memcpy(local_398,util::hex_literals::detail::Hex<163ul>{std::array<std::byte_81ul>,0x51);
  b_01._M_extent._M_extent_value = 0x51;
  b_01._M_ptr = local_398;
  ppVar9 = &CScript::operator<<(pCVar10,b_01)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode);
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_470 = "";
  local_488 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
  local_480 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar18;
  msg_01.m_begin = pvVar16;
  file_01.m_end = (iterator)0x35d;
  file_01.m_begin = (iterator)&local_478;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_488,
             msg_01);
  local_398[8] = 0;
  local_398._0_8_ = &PTR__lazy_ostream_01139f30;
  uStack_380 = "";
  local_388 = boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_490 = (pointer)0xc3e5c9;
  poVar19 = &opcode;
  opcode = OP_4;
  uVar12 = ((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size;
  non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar12 - 0x1d;
  if (uVar12 < 0x1d) {
    non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar12;
  }
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_398,&local_498,0x35d,1,2,poVar19,"MAX_OP_RETURN_RELAY + 1",
             (CMutableTransaction *)&non_push_ops,"t.vout[0].scriptPubKey.size()");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"scriptpubkey",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_05);
  std::__cxx11::string::~string((string *)local_398);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_RETURN);
  pCVar11 = (CMutableTransaction *)
            CScript::operator<<(pCVar10,(span<const_std::byte,_18446744073709551615UL>)ZEXT816(0));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_RETURN);
  opcode = opcode & ~OP_INVALIDOPCODE;
  b_02._M_extent._M_extent_value = 1;
  b_02._M_ptr = (pointer)&opcode;
  pCVar10 = CScript::operator<<(pCVar10,b_02);
  non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 1;
  b_03._M_extent._M_extent_value = 1;
  b_03._M_ptr = (pointer)&non_push_ops;
  pCVar11 = (CMutableTransaction *)CScript::operator<<(pCVar10,b_03);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_RETURN);
  pCVar10 = CScript::operator<<(pCVar10,OP_RESERVED);
  pCVar10 = CScript::push_int64(pCVar10,-1);
  pCVar10 = CScript::push_int64(pCVar10,0);
  opcode = CONCAT31(opcode._1_3_,1);
  b_04._M_extent._M_extent_value = 1;
  b_04._M_ptr = (pointer)&opcode;
  pCVar10 = CScript::operator<<(pCVar10,b_04);
  pCVar10 = CScript::push_int64(pCVar10,2);
  pCVar10 = CScript::push_int64(pCVar10,3);
  pCVar10 = CScript::push_int64(pCVar10,4);
  pCVar10 = CScript::push_int64(pCVar10,5);
  pCVar10 = CScript::push_int64(pCVar10,6);
  pCVar10 = CScript::push_int64(pCVar10,7);
  pCVar10 = CScript::push_int64(pCVar10,8);
  pCVar10 = CScript::push_int64(pCVar10,9);
  pCVar10 = CScript::push_int64(pCVar10,10);
  pCVar10 = CScript::push_int64(pCVar10,0xb);
  pCVar10 = CScript::push_int64(pCVar10,0xc);
  pCVar10 = CScript::push_int64(pCVar10,0xd);
  pCVar10 = CScript::push_int64(pCVar10,0xe);
  pCVar10 = CScript::push_int64(pCVar10,0xf);
  pCVar11 = (CMutableTransaction *)CScript::push_int64(pCVar10,0x10);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  local_2e8.pi_ = (sp_counted_base *)0x0;
  pcStack_2e0 = (char *)0x0;
  opcode = OP_0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  uStack_2f0 = '\0';
  uStack_2ef = '\0';
  uStack_2ee = '\0';
  uStack_2ed = '\0';
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  pCVar10 = CScript::operator<<((CScript *)&opcode,OP_RETURN);
  pCVar10 = CScript::push_int64(pCVar10,0);
  non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 1;
  b_05._M_extent._M_extent_value = 1;
  b_05._M_ptr = (pointer)&non_push_ops;
  pCVar10 = CScript::operator<<(pCVar10,b_05);
  pCVar10 = CScript::push_int64(pCVar10,2);
  uStack_380._0_4_ = 0xffffffff;
  local_388 = (undefined1 *)0xffffffffffffffff;
  uStack_380._4_4_ = 0xffffffff;
  local_398._8_4_ = 0xffffffff;
  local_398._0_8_ = 0xffffffffffffffff;
  uStack_38c = 0xffffffff;
  local_378 = 0xffffffff;
  b_06._M_extent._M_extent_value = 0x24;
  b_06._M_ptr = local_398;
  pCVar11 = (CMutableTransaction *)CScript::operator<<(pCVar10,b_06);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode);
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_RETURN);
  ppVar9 = &CScript::operator<<(pCVar10,OP_RETURN)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"scriptpubkey",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_06);
  std::__cxx11::string::~string((string *)local_398);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(this_00,1);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar11 = (CMutableTransaction *)CScript::operator<<((CScript *)local_398,OP_RETURN);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(this_00,2);
  local_2e8.pi_ = (sp_counted_base *)0x0;
  pcStack_2e0 = (char *)0x0;
  opcode = OP_0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  uStack_2f0 = '\0';
  uStack_2ef = '\0';
  uStack_2ee = '\0';
  uStack_2ed = '\0';
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  pCVar10 = CScript::operator<<((CScript *)&opcode,OP_RETURN);
  local_388 = (undefined1 *)0x939e028a8d65c10;
  uStack_380 = -0x219ee0151f9d865a;
  local_398._0_8_ = 0x4855feb0fd8a6704;
  stack0xfffffffffffffc70 = (pointer)0xb73071a6f1671927;
  _local_378 = 0x38ef4c3fbcf649b6;
  b_07._M_extent._M_extent_value = 0x28;
  b_07._M_ptr = local_398;
  ppVar9 = &CScript::operator<<(pCVar10,b_07)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0;
  local_2e8.pi_ = (sp_counted_base *)0x0;
  pcStack_2e0 = (char *)0x0;
  opcode = OP_0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  uStack_2f0 = '\0';
  uStack_2ef = '\0';
  uStack_2ee = '\0';
  uStack_2ed = '\0';
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  pCVar10 = CScript::operator<<((CScript *)&opcode,OP_RETURN);
  local_388 = (undefined1 *)0x939e028a8d65c10;
  uStack_380 = -0x219ee0151f9d865a;
  local_398._0_8_ = 0x4855feb0fd8a6704;
  stack0xfffffffffffffc70 = (pointer)0xb73071a6f1671927;
  _local_378 = 0x38ef4c3fbcf649b6;
  b_08._M_extent._M_extent_value = 0x28;
  b_08._M_ptr = local_398;
  ppVar9 = &CScript::operator<<(pCVar10,b_08)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,ppVar9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode);
  t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"multi-op-return",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_07);
  std::__cxx11::string::~string((string *)local_398);
  local_2e8.pi_ = (sp_counted_base *)0x0;
  pcStack_2e0 = (char *)0x0;
  opcode = OP_0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  uStack_2f0 = '\0';
  uStack_2ef = '\0';
  uStack_2ee = '\0';
  uStack_2ed = '\0';
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  pCVar10 = CScript::operator<<((CScript *)&opcode,OP_RETURN);
  uStack_380 = 0xde611feae06279a6;
  local_388 = (undefined1 *)0x939e028a8d65c10;
  stack0xfffffffffffffc70 = 0xb73071a6f1671927;
  local_398._0_8_ = 0x4855feb0fd8a6704;
  _local_378 = 0x38ef4c3fbcf649b6;
  b_09._M_extent._M_extent_value = 0x28;
  b_09._M_ptr = local_398;
  ppVar9 = &CScript::operator<<(pCVar10,b_09)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  ppVar9 = &CScript::operator<<((CScript *)local_398,OP_RETURN)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,ppVar9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"multi-op-return",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_08);
  std::__cxx11::string::~string((string *)local_398);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  ppVar9 = &CScript::operator<<((CScript *)local_398,OP_RETURN)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  ppVar9 = &CScript::operator<<((CScript *)local_398,OP_RETURN)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,ppVar9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"multi-op-return",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_09);
  std::__cxx11::string::~string((string *)local_398);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(this_00,1);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 2100000000000000;
  CKey::GetPubKey((CPubKey *)&opcode,&key);
  PKHash::PKHash((PKHash *)&local_310,(CPubKey *)&opcode);
  local_388._0_4_ = local_310._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
  local_350 = '\x02';
  GetScriptForDestination((CScript *)&non_push_ops,(CTxDestination *)local_398);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&non_push_ops);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&non_push_ops);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_398);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x66f,
             (value_type_conflict3 *)&non_push_ops,(allocator_type *)&local_310);
  b_10._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_10._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  pCVar11 = (CMutableTransaction *)CScript::operator<<((CScript *)local_398,b_10);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ =
       (uint)non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start._1_3_ << 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x670,
             (value_type_conflict3 *)&non_push_ops,(allocator_type *)&local_310);
  b_11._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_11._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  ppVar9 = &CScript::operator<<((CScript *)local_398,b_11)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar9);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"scriptsig-size",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_10);
  std::__cxx11::string::~string((string *)local_398);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_1);
  pCVar10 = CScript::operator<<(pCVar10,OP_0);
  pCVar10 = CScript::operator<<(pCVar10,OP_1NEGATE);
  pCVar10 = CScript::operator<<(pCVar10,OP_16);
  pc.ptr = pc.ptr & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x4b,
             (value_type_conflict3 *)&pc,(allocator_type *)&local_4dc);
  b_12._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_12._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  pCVar10 = CScript::operator<<(pCVar10,b_12);
  local_499 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&non_push_ops,0xeb,&local_499,&local_49a);
  b_13._M_extent._M_extent_value =
       (long)non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)CONCAT44(non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      (uint)non_push_ops.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  b_13._M_ptr = (pointer)CONCAT44(non_push_ops.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (uint)non_push_ops.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
  pCVar10 = CScript::operator<<(pCVar10,b_13);
  local_49b = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_310,0x4d2,&local_49b,
             &local_49c);
  b_14._M_extent._M_extent_value =
       (long)local_310._M_impl.super__Vector_impl_data._M_finish -
       (long)local_310._M_impl.super__Vector_impl_data._M_start;
  b_14._M_ptr = (local_310._M_impl.super__Vector_impl_data._M_start)->vch;
  pCVar10 = CScript::operator<<(pCVar10,b_14);
  pCVar11 = (CMutableTransaction *)CScript::operator<<(pCVar10,OP_9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_310);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  auVar5 = _local_398;
  local_398._8_4_ = 0xacabaa94;
  local_398._0_8_ = 0x9387826f7b636961;
  uStack_38c._1_3_ = auVar5._13_3_;
  uStack_38c._0_1_ = 0xb1;
  __l._M_len = 0xd;
  __l._M_array = local_398;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&non_push_ops,__l,(allocator_type *)&opcode);
  uVar12 = ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
            ._M_start)->scriptSig).super_CScriptBase._size;
  pCVar10 = (CScript *)
            ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union.
            indirect_contents.indirect;
  pc.ptr = (uchar *)&(t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptSig;
  if (0x1c < uVar12) {
    pc.ptr = (uchar *)pCVar10;
  }
  while( true ) {
    cVar3.ptr = pc.ptr;
    pCVar11 = (CMutableTransaction *)&pc;
    uVar14 = uVar12 - 0x1d;
    if (uVar12 < 0x1d) {
      uVar14 = uVar12;
    }
    if (uVar12 < 0x1d) {
      pCVar10 = &(t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptSig;
    }
    if ((pCVar10->super_CScriptBase)._union.direct + (int)uVar14 <= pc.ptr) break;
    CScript::GetOp(&(t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start)->scriptSig,(const_iterator *)pCVar11,&opcode)
    ;
    puVar6 = non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (0x4d < opcode + ~OP_0) {
      if (((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
           _M_start)->scriptSig).super_CScriptBase._size < 0x1d) {
        iVar13 = (int)t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x28;
      }
      else {
        iVar13 = *(int *)&((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union;
      }
      iVar13 = (int)cVar3.ptr - iVar13;
      uVar1 = *cVar3.ptr;
      for (puVar21 = (pointer)CONCAT44(non_push_ops.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (uint)non_push_ops.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
          puVar21 != puVar6; puVar21 = puVar21 + 1) {
        if (((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size < 0x1d) {
          pCVar10 = &(t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptSig;
        }
        else {
          pCVar10 = (CScript *)
                    ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union.
                    indirect_contents.indirect;
        }
        (pCVar10->super_CScriptBase)._union.direct[iVar13] = *puVar21;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_398,"scriptsig-not-pushonly",(allocator<char> *)&local_310);
        pCVar11 = (CMutableTransaction *)local_398;
        test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_11);
        std::__cxx11::string::~string((string *)local_398);
      }
      if (((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
           _M_start)->scriptSig).super_CScriptBase._size < 0x1d) {
        pCVar10 = &(t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->scriptSig;
      }
      else {
        pCVar10 = (CScript *)
                  ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union.
                  indirect_contents.indirect;
      }
      (pCVar10->super_CScriptBase)._union.direct[iVar13] = uVar1;
      test_method()::$_0::operator()((__0 *)&t,pCVar11);
    }
    uVar12 = ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size;
    pCVar10 = (CScript *)
              ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union.
              indirect_contents.indirect;
  }
  std::vector<CTxIn,_std::allocator<CTxIn>_>::clear(&t.vin);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&t.vin,0x986);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_RETURN);
  local_310._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_310._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x13,
             (value_type_conflict3 *)&local_310,(allocator_type *)&local_4dc);
  b_15._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_15._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  ppVar9 = &CScript::operator<<(pCVar10,b_15)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar9);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  local_4d8._32_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_4d8._40_8_ = "";
  local_4d8._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8._24_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)poVar19;
  msg_02.m_begin = pvVar16;
  file_02.m_end = (iterator)0x3b9;
  file_02.m_begin = local_4d8 + 0x20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
             (size_t)(local_4d8 + 0x10),msg_02);
  uStack_2f0 = '\0';
  opcode = 0x1139f30;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  local_2e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcStack_2e0 = "";
  local_4d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_4d8._8_8_ = "";
  CTransaction::CTransaction((CTransaction *)local_398,&t);
  iVar8 = GetTransactionWeight((CTransaction *)local_398);
  p_Var20 = &local_310;
  local_310._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_310._M_impl.super__Vector_impl_data._M_start._4_4_,iVar8);
  local_4dc = 400000;
  pCVar11 = (CMutableTransaction *)local_4d8;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&opcode,pCVar11,0x3b9,1,2,p_Var20,"GetTransactionWeight(CTransaction(t))",
             (allocator_type *)&local_4dc,"400000");
  CTransaction::~CTransaction((CTransaction *)local_398);
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_RETURN);
  local_310._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_310._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x14,
             (value_type_conflict3 *)&local_310,(allocator_type *)&local_4dc);
  b_16._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_16._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  ppVar9 = &CScript::operator<<(pCVar10,b_16)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar9);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)p_Var20;
  msg_03.m_begin = pvVar16;
  file_03.m_end = (iterator)0x3be;
  file_03.m_begin = (iterator)&local_4f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_500,
             msg_03);
  uStack_2f0 = '\0';
  opcode = 0x1139f30;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  local_2e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcStack_2e0 = "";
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_508 = "";
  CTransaction::CTransaction((CTransaction *)local_398,&t);
  iVar8 = GetTransactionWeight((CTransaction *)local_398);
  p_Var20 = &local_310;
  local_310._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_310._M_impl.super__Vector_impl_data._M_start._4_4_,iVar8);
  local_4dc = 0x61a84;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&opcode,&local_510,0x3be,1,2,p_Var20,"GetTransactionWeight(CTransaction(t))",
             (allocator_type *)&local_4dc,"400004");
  CTransaction::~CTransaction((CTransaction *)local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"tx-size",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_12);
  std::__cxx11::string::~string((string *)local_398);
  g_bare_multi = 0;
  CKey::GetPubKey((CPubKey *)local_398,&key);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_398;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)&local_310,__l_00,
             (allocator_type *)&local_4dc);
  GetScriptForMultisig((CScript *)&opcode,1,(vector<CPubKey,_std::allocator<CPubKey>_> *)&local_310)
  ;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode);
  std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base(&local_310);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&t.vin,1);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  local_310._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_310._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x41,
             (value_type_conflict3 *)&local_310,(allocator_type *)&local_4dc);
  b_17._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_17._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  pCVar11 = (CMutableTransaction *)CScript::operator<<((CScript *)local_398,b_17);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  g_bare_multi = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"bare-multisig",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_13);
  std::__cxx11::string::~string((string *)local_398);
  g_bare_multi = 0;
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  local_310._M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator_type)0x2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x21,
             (value_type_conflict3 *)&local_310,(allocator_type *)&local_4dc);
  b_18._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_18._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  pCVar10 = CScript::operator<<((CScript *)local_398,b_18);
  pCVar11 = (CMutableTransaction *)CScript::operator<<(pCVar10,OP_CHECKSIG);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x240;
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x23f;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"dust",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_14);
  std::__cxx11::string::~string((string *)local_398);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  local_310._M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator_type)0x4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x41,
             (value_type_conflict3 *)&local_310,(allocator_type *)&local_4dc);
  b_19._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_19._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  pCVar10 = CScript::operator<<((CScript *)local_398,b_19);
  pCVar11 = (CMutableTransaction *)CScript::operator<<(pCVar10,OP_CHECKSIG);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x2a0;
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x29f;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"dust",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_15);
  std::__cxx11::string::~string((string *)local_398);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_DUP);
  pCVar10 = CScript::operator<<(pCVar10,OP_HASH160);
  local_310._M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator_type)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x14,
             (value_type_conflict3 *)&local_310,(allocator_type *)&local_4dc);
  b_20._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_20._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  pCVar10 = CScript::operator<<(pCVar10,b_20);
  pCVar10 = CScript::operator<<(pCVar10,OP_EQUALVERIFY);
  pCVar11 = (CMutableTransaction *)CScript::operator<<(pCVar10,OP_CHECKSIG);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x222;
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x221;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"dust",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_16);
  std::__cxx11::string::~string((string *)local_398);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_HASH160);
  local_310._M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator_type)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x14,
             (value_type_conflict3 *)&local_310,(allocator_type *)&local_4dc);
  b_21._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_21._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  pCVar10 = CScript::operator<<(pCVar10,b_21);
  pCVar11 = (CMutableTransaction *)CScript::operator<<(pCVar10,OP_EQUAL);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x21c;
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x21b;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"dust",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_17);
  std::__cxx11::string::~string((string *)local_398);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_0);
  local_310._M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator_type)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x14,
             (value_type_conflict3 *)&local_310,(allocator_type *)&local_4dc);
  b_22._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_22._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  pCVar11 = (CMutableTransaction *)CScript::operator<<(pCVar10,b_22);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x126;
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x125;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"dust",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_18);
  std::__cxx11::string::~string((string *)local_398);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_0);
  local_310._M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator_type)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x20,
             (value_type_conflict3 *)&local_310,(allocator_type *)&local_4dc);
  b_23._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_23._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  pCVar11 = (CMutableTransaction *)CScript::operator<<(pCVar10,b_23);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x14a;
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x149;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"dust",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_19);
  std::__cxx11::string::~string((string *)local_398);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_1);
  local_310._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_310._M_impl.super__Vector_impl_data._M_start._1_7_ << 8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,0x20,
             (value_type_conflict3 *)&local_310,(allocator_type *)&local_4dc);
  b_24._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_24._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  pCVar11 = (CMutableTransaction *)CScript::operator<<(pCVar10,b_24);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x14a;
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x149;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"dust",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_20);
  std::__cxx11::string::~string((string *)local_398);
  for (oVar15 = OP_1; oVar15 != OP_NOP; oVar15 = oVar15 + 1) {
    _local_388 = (undefined1  [16])0x0;
    _local_398 = (undefined1  [16])0x0;
    pCVar10 = CScript::operator<<((CScript *)local_398,oVar15);
    local_310._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_310._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,2,
               (value_type_conflict3 *)&local_310,(allocator_type *)&local_4dc);
    b_25._M_extent._M_extent_value =
         CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
    b_25._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
    pCVar11 = (CMutableTransaction *)CScript::operator<<(pCVar10,b_25);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar11);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
    (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue = 0xf0;
    test_method()::$_0::operator()((__0 *)&t,pCVar11);
    (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue = 0xef;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_398,"dust",(allocator<char> *)&opcode);
    test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_21);
    std::__cxx11::string::~string((string *)local_398);
  }
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pCVar10 = CScript::operator<<((CScript *)local_398,OP_1);
  local_310._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_310._M_impl.super__Vector_impl_data._M_start._2_6_,0x734e);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_310;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,__l_01,
             (allocator_type *)&local_4dc);
  b_26._M_extent._M_extent_value =
       CONCAT71(_uStack_2ef,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_26._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  ppVar9 = &CScript::operator<<(pCVar10,b_26)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar9);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  local_520 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)p_Var20;
  msg_04.m_begin = pvVar16;
  file_04.m_end = (iterator)0x409;
  file_04.m_begin = (iterator)&local_520;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_530,
             msg_04);
  _cVar22 = 0x53962c;
  bVar7 = CScript::IsPayToAnchor
                    (&(t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start)->scriptPubKey);
  opcode = CONCAT31(opcode._1_3_,bVar7);
  uStack_2f0 = '\0';
  uStack_2ef = '\0';
  uStack_2ee = '\0';
  uStack_2ed = '\0';
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  local_2e8.pi_ = (sp_counted_base *)0x0;
  local_310._M_impl.super__Vector_impl_data._M_start = (pointer)0xc3edda;
  local_310._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc3ee00;
  pCVar11 = (CMutableTransaction *)local_398;
  local_398[8] = 0;
  local_398._0_8_ = &PTR__lazy_ostream_0113a070;
  uStack_380 = &local_310;
  local_388 = boost::unit_test::lazy_ostream::inst;
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_538 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&opcode,(lazy_ostream *)pCVar11,1,0,WARN,_cVar22,(size_t)&local_540
             ,0x409);
  boost::detail::shared_count::~shared_count(&local_2e8);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0xf0;
  test_method()::$_0::operator()((__0 *)&t,pCVar11);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0xef;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"dust",(allocator<char> *)&opcode);
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_22);
  std::__cxx11::string::~string((string *)local_398);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key.keydata);
  CMutableTransaction::~CMutableTransaction(&t);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            (&dummyTransactions);
  CCoinsViewCache::~CCoinsViewCache(&coins);
  FillableSigningProvider::~FillableSigningProvider(&keystore);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_IsStandard)
{
    FillableSigningProvider keystore;
    CCoinsView coinsDummy;
    CCoinsViewCache coins(&coinsDummy);
    std::vector<CMutableTransaction> dummyTransactions =
        SetupDummyInputs(keystore, coins, {11*CENT, 50*CENT, 21*CENT, 22*CENT});

    CMutableTransaction t;
    t.vin.resize(1);
    t.vin[0].prevout.hash = dummyTransactions[0].GetHash();
    t.vin[0].prevout.n = 1;
    t.vin[0].scriptSig << std::vector<unsigned char>(65, 0);
    t.vout.resize(1);
    t.vout[0].nValue = 90*CENT;
    CKey key = GenerateRandomKey();
    t.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key.GetPubKey()));

    constexpr auto CheckIsStandard = [](const auto& t) {
        std::string reason;
        BOOST_CHECK(IsStandardTx(CTransaction{t}, MAX_OP_RETURN_RELAY, g_bare_multi, g_dust, reason));
        BOOST_CHECK(reason.empty());
    };
    constexpr auto CheckIsNotStandard = [](const auto& t, const std::string& reason_in) {
        std::string reason;
        BOOST_CHECK(!IsStandardTx(CTransaction{t}, MAX_OP_RETURN_RELAY, g_bare_multi, g_dust, reason));
        BOOST_CHECK_EQUAL(reason_in, reason);
    };

    CheckIsStandard(t);

    // Check dust with default relay fee:
    CAmount nDustThreshold = 182 * g_dust.GetFeePerK() / 1000;
    BOOST_CHECK_EQUAL(nDustThreshold, 546);
    // dust:
    t.vout[0].nValue = nDustThreshold - 1;
    CheckIsNotStandard(t, "dust");
    // not dust:
    t.vout[0].nValue = nDustThreshold;
    CheckIsStandard(t);

    // Disallowed version
    t.version = std::numeric_limits<uint32_t>::max();
    CheckIsNotStandard(t, "version");

    t.version = 0;
    CheckIsNotStandard(t, "version");

    t.version = TX_MAX_STANDARD_VERSION + 1;
    CheckIsNotStandard(t, "version");

    // Allowed version
    t.version = 1;
    CheckIsStandard(t);

    t.version = 2;
    CheckIsStandard(t);

    // Check dust with odd relay fee to verify rounding:
    // nDustThreshold = 182 * 3702 / 1000
    g_dust = CFeeRate(3702);
    // dust:
    t.vout[0].nValue = 674 - 1;
    CheckIsNotStandard(t, "dust");
    // not dust:
    t.vout[0].nValue = 674;
    CheckIsStandard(t);
    g_dust = CFeeRate{DUST_RELAY_TX_FEE};

    t.vout[0].scriptPubKey = CScript() << OP_1;
    CheckIsNotStandard(t, "scriptpubkey");

    // MAX_OP_RETURN_RELAY-byte TxoutType::NULL_DATA (standard)
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef3804678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38"_hex;
    BOOST_CHECK_EQUAL(MAX_OP_RETURN_RELAY, t.vout[0].scriptPubKey.size());
    CheckIsStandard(t);

    // MAX_OP_RETURN_RELAY+1-byte TxoutType::NULL_DATA (non-standard)
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef3804678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef3800"_hex;
    BOOST_CHECK_EQUAL(MAX_OP_RETURN_RELAY + 1, t.vout[0].scriptPubKey.size());
    CheckIsNotStandard(t, "scriptpubkey");

    // Data payload can be encoded in any way...
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << ""_hex;
    CheckIsStandard(t);
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "00"_hex << "01"_hex;
    CheckIsStandard(t);
    // OP_RESERVED *is* considered to be a PUSHDATA type opcode by IsPushOnly()!
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << OP_RESERVED << -1 << 0 << "01"_hex << 2 << 3 << 4 << 5 << 6 << 7 << 8 << 9 << 10 << 11 << 12 << 13 << 14 << 15 << 16;
    CheckIsStandard(t);
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << 0 << "01"_hex << 2 << "ffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffff"_hex;
    CheckIsStandard(t);

    // ...so long as it only contains PUSHDATA's
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << OP_RETURN;
    CheckIsNotStandard(t, "scriptpubkey");

    // TxoutType::NULL_DATA w/o PUSHDATA
    t.vout.resize(1);
    t.vout[0].scriptPubKey = CScript() << OP_RETURN;
    CheckIsStandard(t);

    // Only one TxoutType::NULL_DATA permitted in all cases
    t.vout.resize(2);
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38"_hex;
    t.vout[0].nValue = 0;
    t.vout[1].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38"_hex;
    t.vout[1].nValue = 0;
    CheckIsNotStandard(t, "multi-op-return");

    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38"_hex;
    t.vout[1].scriptPubKey = CScript() << OP_RETURN;
    CheckIsNotStandard(t, "multi-op-return");

    t.vout[0].scriptPubKey = CScript() << OP_RETURN;
    t.vout[1].scriptPubKey = CScript() << OP_RETURN;
    CheckIsNotStandard(t, "multi-op-return");

    // Check large scriptSig (non-standard if size is >1650 bytes)
    t.vout.resize(1);
    t.vout[0].nValue = MAX_MONEY;
    t.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key.GetPubKey()));
    // OP_PUSHDATA2 with len (3 bytes) + data (1647 bytes) = 1650 bytes
    t.vin[0].scriptSig = CScript() << std::vector<unsigned char>(1647, 0); // 1650
    CheckIsStandard(t);

    t.vin[0].scriptSig = CScript() << std::vector<unsigned char>(1648, 0); // 1651
    CheckIsNotStandard(t, "scriptsig-size");

    // Check scriptSig format (non-standard if there are any other ops than just PUSHs)
    t.vin[0].scriptSig = CScript()
        << OP_TRUE << OP_0 << OP_1NEGATE << OP_16 // OP_n (single byte pushes: n = 1, 0, -1, 16)
        << std::vector<unsigned char>(75, 0)      // OP_PUSHx [...x bytes...]
        << std::vector<unsigned char>(235, 0)     // OP_PUSHDATA1 x [...x bytes...]
        << std::vector<unsigned char>(1234, 0)    // OP_PUSHDATA2 x [...x bytes...]
        << OP_9;
    CheckIsStandard(t);

    const std::vector<unsigned char> non_push_ops = { // arbitrary set of non-push operations
        OP_NOP, OP_VERIFY, OP_IF, OP_ROT, OP_3DUP, OP_SIZE, OP_EQUAL, OP_ADD, OP_SUB,
        OP_HASH256, OP_CODESEPARATOR, OP_CHECKSIG, OP_CHECKLOCKTIMEVERIFY };

    CScript::const_iterator pc = t.vin[0].scriptSig.begin();
    while (pc < t.vin[0].scriptSig.end()) {
        opcodetype opcode;
        CScript::const_iterator prev_pc = pc;
        t.vin[0].scriptSig.GetOp(pc, opcode); // advance to next op
        // for the sake of simplicity, we only replace single-byte push operations
        if (opcode >= 1 && opcode <= OP_PUSHDATA4)
            continue;

        int index = prev_pc - t.vin[0].scriptSig.begin();
        unsigned char orig_op = *prev_pc; // save op
        // replace current push-op with each non-push-op
        for (auto op : non_push_ops) {
            t.vin[0].scriptSig[index] = op;
            CheckIsNotStandard(t, "scriptsig-not-pushonly");
        }
        t.vin[0].scriptSig[index] = orig_op; // restore op
        CheckIsStandard(t);
    }

    // Check tx-size (non-standard if transaction weight is > MAX_STANDARD_TX_WEIGHT)
    t.vin.clear();
    t.vin.resize(2438); // size per input (empty scriptSig): 41 bytes
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << std::vector<unsigned char>(19, 0); // output size: 30 bytes
    // tx header:                12 bytes =>     48 weight units
    // 2438 inputs: 2438*41 = 99958 bytes => 399832 weight units
    //    1 output:              30 bytes =>    120 weight units
    //                      ======================================
    //                                total: 400000 weight units
    BOOST_CHECK_EQUAL(GetTransactionWeight(CTransaction(t)), 400000);
    CheckIsStandard(t);

    // increase output size by one byte, so we end up with 400004 weight units
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << std::vector<unsigned char>(20, 0); // output size: 31 bytes
    BOOST_CHECK_EQUAL(GetTransactionWeight(CTransaction(t)), 400004);
    CheckIsNotStandard(t, "tx-size");

    // Check bare multisig (standard if policy flag g_bare_multi is set)
    g_bare_multi = true;
    t.vout[0].scriptPubKey = GetScriptForMultisig(1, {key.GetPubKey()}); // simple 1-of-1
    t.vin.resize(1);
    t.vin[0].scriptSig = CScript() << std::vector<unsigned char>(65, 0);
    CheckIsStandard(t);

    g_bare_multi = false;
    CheckIsNotStandard(t, "bare-multisig");
    g_bare_multi = DEFAULT_PERMIT_BAREMULTISIG;

    // Check compressed P2PK outputs dust threshold (must have leading 02 or 03)
    t.vout[0].scriptPubKey = CScript() << std::vector<unsigned char>(33, 0x02) << OP_CHECKSIG;
    t.vout[0].nValue = 576;
    CheckIsStandard(t);
    t.vout[0].nValue = 575;
    CheckIsNotStandard(t, "dust");

    // Check uncompressed P2PK outputs dust threshold (must have leading 04/06/07)
    t.vout[0].scriptPubKey = CScript() << std::vector<unsigned char>(65, 0x04) << OP_CHECKSIG;
    t.vout[0].nValue = 672;
    CheckIsStandard(t);
    t.vout[0].nValue = 671;
    CheckIsNotStandard(t, "dust");

    // Check P2PKH outputs dust threshold
    t.vout[0].scriptPubKey = CScript() << OP_DUP << OP_HASH160 << std::vector<unsigned char>(20, 0) << OP_EQUALVERIFY << OP_CHECKSIG;
    t.vout[0].nValue = 546;
    CheckIsStandard(t);
    t.vout[0].nValue = 545;
    CheckIsNotStandard(t, "dust");

    // Check P2SH outputs dust threshold
    t.vout[0].scriptPubKey = CScript() << OP_HASH160 << std::vector<unsigned char>(20, 0) << OP_EQUAL;
    t.vout[0].nValue = 540;
    CheckIsStandard(t);
    t.vout[0].nValue = 539;
    CheckIsNotStandard(t, "dust");

    // Check P2WPKH outputs dust threshold
    t.vout[0].scriptPubKey = CScript() << OP_0 << std::vector<unsigned char>(20, 0);
    t.vout[0].nValue = 294;
    CheckIsStandard(t);
    t.vout[0].nValue = 293;
    CheckIsNotStandard(t, "dust");

    // Check P2WSH outputs dust threshold
    t.vout[0].scriptPubKey = CScript() << OP_0 << std::vector<unsigned char>(32, 0);
    t.vout[0].nValue = 330;
    CheckIsStandard(t);
    t.vout[0].nValue = 329;
    CheckIsNotStandard(t, "dust");

    // Check P2TR outputs dust threshold (Invalid xonly key ok!)
    t.vout[0].scriptPubKey = CScript() << OP_1 << std::vector<unsigned char>(32, 0);
    t.vout[0].nValue = 330;
    CheckIsStandard(t);
    t.vout[0].nValue = 329;
    CheckIsNotStandard(t, "dust");

    // Check future Witness Program versions dust threshold (non-32-byte pushes are undefined for version 1)
    for (int op = OP_1; op <= OP_16; op += 1) {
        t.vout[0].scriptPubKey = CScript() << (opcodetype)op << std::vector<unsigned char>(2, 0);
        t.vout[0].nValue = 240;
        CheckIsStandard(t);

        t.vout[0].nValue = 239;
        CheckIsNotStandard(t, "dust");
    }

    // Check anchor outputs
    t.vout[0].scriptPubKey = CScript() << OP_1 << std::vector<unsigned char>{0x4e, 0x73};
    BOOST_CHECK(t.vout[0].scriptPubKey.IsPayToAnchor());
    t.vout[0].nValue = 240;
    CheckIsStandard(t);
    t.vout[0].nValue = 239;
    CheckIsNotStandard(t, "dust");
}